

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O2

DHUDMessage * __thiscall DBaseStatusBar::DetachMessage(DBaseStatusBar *this,DWORD id)

{
  DHUDMessage *pDVar1;
  TObjPtr<DHUDMessage> TVar2;
  long lVar3;
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 *obj;
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 *obj_00;
  
  lVar3 = 0;
  do {
    if (lVar3 == 3) {
      return (DHUDMessage *)0x0;
    }
    obj_00 = &this->Messages[lVar3].field_0;
    while (obj = obj_00, pDVar1 = GC::ReadBarrier<DHUDMessage>(&obj->p),
          pDVar1 != (DHUDMessage *)0x0) {
      obj_00 = &(pDVar1->Next).field_0;
      if (pDVar1->SBarID == id) {
        TVar2.field_0 =
             (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)
             GC::ReadBarrier<DHUDMessage>(&obj_00->p);
        obj->p = (DHUDMessage *)TVar2.field_0;
        (((TObjPtr<DHUDMessage> *)obj_00)->field_0).p = (DHUDMessage *)0x0;
        if (screen == (DFrameBuffer *)0x0) {
          return pDVar1;
        }
        ST_SetNeedRefresh();
        return pDVar1;
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

DHUDMessage *DBaseStatusBar::DetachMessage (DWORD id)
{
	for (size_t i = 0; i < countof(Messages); ++i)
	{
		DHUDMessage *probe = Messages[i];
		DHUDMessage **prev = &Messages[i];

		while (probe && probe->SBarID != id)
		{
			prev = &probe->Next;
			probe = probe->Next;
		}
		if (probe != NULL)
		{
			*prev = probe->Next;
			probe->Next = NULL;
			// Redraw the status bar in case it was covered
			if (screen != NULL)
			{
				ST_SetNeedRefresh();
			}
			return probe;
		}
	}
	return NULL;
}